

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

LY_ERR ly_vprint_(ly_out *out,char *format,__va_list_tag *ap)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  int iVar3;
  char **ppcVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  LY_ERR LVar8;
  ulong __n;
  char *msg;
  char *local_30;
  
  local_30 = (char *)0x0;
  LVar8 = LY_SUCCESS;
  uVar2 = 0;
  switch(out->type) {
  case LY_OUT_FD:
    uVar2 = vdprintf((out->method).fd,format,ap);
    break;
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    uVar2 = vfprintf((FILE *)(out->method).f,format,ap);
    break;
  case LY_OUT_MEMORY:
    uVar2 = vasprintf(&local_30,format,ap);
    if (-1 < (int)uVar2) {
      __n = (ulong)uVar2;
      pauVar1 = (undefined1 (*) [16])((long)&out->method + 8);
      ppcVar4 = (out->method).mem.buf;
      pcVar7 = (out->method).fpath.filepath;
      if ((char *)(out->method).mem.size < pcVar7 + __n + 1) {
        pcVar7 = (char *)ly_realloc(*ppcVar4,(size_t)(pcVar7 + __n + 1));
        *(out->method).mem.buf = pcVar7;
        ppcVar4 = (out->method).mem.buf;
        if (*ppcVar4 == (char *)0x0) {
          *pauVar1 = (undefined1  [16])0x0;
          free(local_30);
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vprint_");
          return LY_EMEM;
        }
        pcVar7 = (out->method).fpath.filepath;
        (out->method).mem.size = (size_t)(pcVar7 + __n + 1);
      }
      if (uVar2 != 0) {
        memcpy(pcVar7 + (long)*ppcVar4,local_30,__n);
        ppcVar4 = (out->method).mem.buf;
        pcVar7 = (out->method).fpath.filepath;
      }
      *(char **)*pauVar1 = pcVar7 + __n;
      (*ppcVar4)[(long)(pcVar7 + __n)] = '\0';
      free(local_30);
      goto LAB_0013b0c6;
    }
    goto LAB_0013b1ab;
  case LY_OUT_CALLBACK:
    iVar3 = vasprintf(&local_30,format,ap);
    if (iVar3 < 0) goto LAB_0013b1ab;
    sVar5 = (*(out->method).clb.func)((out->method).fpath.filepath,local_30,(size_t)iVar3);
    uVar2 = (uint)sVar5;
    free(local_30);
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x1e2);
    return LY_EINT;
  default:
    goto switchD_0013b076_default;
  }
  if ((int)uVar2 < 0) {
LAB_0013b1ab:
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    uVar2 = 0;
    LVar8 = LY_ESYS;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_vprint_",pcVar7);
  }
  else {
LAB_0013b0c6:
    if (out->type == LY_OUT_FDSTREAM) {
      lseek((out->method).fdstream.fd,0,2);
    }
  }
switchD_0013b076_default:
  out->printed = (ulong)uVar2 + out->printed;
  out->func_printed = (ulong)uVar2 + out->func_printed;
  return LVar8;
}

Assistant:

static LY_ERR
ly_vprint_(struct ly_out *out, const char *format, va_list ap)
{
    LY_ERR ret;
    int written = 0;
    char *msg = NULL;

    switch (out->type) {
    case LY_OUT_FD:
        written = vdprintf(out->method.fd, format, ap);
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = vfprintf(out->method.f, format, ap);
        break;
    case LY_OUT_MEMORY:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        if (out->method.mem.len + written + 1 > out->method.mem.size) {
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, out->method.mem.len + written + 1);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                free(msg);
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = out->method.mem.len + written + 1;
        }
        if (written) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], msg, written);
        }
        out->method.mem.len += written;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';
        free(msg);
        break;
    case LY_OUT_CALLBACK:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        written = out->method.clb.func(out->method.clb.arg, msg, written);
        free(msg);
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (written < 0) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}